

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O1

GCfunc * lj_lib_pushcc(lua_State *L,lua_CFunction f,int id,int n)

{
  GCfunc *pGVar1;
  
  lua_pushcclosure(L,f,n);
  pGVar1 = (GCfunc *)(L->top[-1].u64 & 0x7fffffffffff);
  (pGVar1->c).ffid = (uint8_t)id;
  (pGVar1->c).pc.ptr64 = (L->glref).ptr64 + 0x168;
  return pGVar1;
}

Assistant:

GCfunc *lj_lib_pushcc(lua_State *L, lua_CFunction f, int id, int n)
{
  GCfunc *fn;
  lua_pushcclosure(L, f, n);
  fn = funcV(L->top-1);
  fn->c.ffid = (uint8_t)id;
  setmref(fn->c.pc, &G(L)->bc_cfunc_int);
  return fn;
}